

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  TestRegistry *pTVar2;
  undefined8 in_RSI;
  int result;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  ApprovalTests::initializeApprovalTestsForCppUTest();
  iVar1 = CommandLineTestRunner::RunAllTests
                    (iVar1,(char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xd])();
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    ApprovalTests::initializeApprovalTestsForCppUTest();

    int result = CommandLineTestRunner::RunAllTests(argc, argv);
    TestRegistry::getCurrentRegistry()->resetPlugins();
    return result;
}